

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O0

size_t mserialize::detail::size_between_balanced(string_view s,char open,char close)

{
  size_type sVar1;
  const_reference pcVar2;
  char in_CL;
  char in_DL;
  size_t i;
  size_t open_count;
  ulong local_28;
  long local_20;
  string_view local_10;
  
  local_20 = 1;
  local_28 = 1;
  do {
    sVar1 = string_view::size(&local_10);
    if (sVar1 <= local_28) {
      return local_28;
    }
    pcVar2 = string_view::operator[](&local_10,local_28);
    if (*pcVar2 == in_DL) {
      local_20 = local_20 + 1;
    }
    else {
      pcVar2 = string_view::operator[](&local_10,local_28);
      if ((*pcVar2 == in_CL) && (local_20 = local_20 + -1, local_20 == 0)) {
        return local_28 + 1;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

inline std::size_t size_between_balanced(string_view s, char open, char close)
{
  std::size_t open_count = 1;
  std::size_t i = 1;

  for (; i < s.size(); ++i)
  {
    if (s[i] == open)
    {
      ++open_count;
    }
    else if (s[i] == close)
    {
      --open_count;
      if (open_count == 0) { ++i; break; }
    }
  }

  return i;
}